

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::OpenRangeExpression::fromSyntax
          (Compilation *comp,OpenRangeExpressionSyntax *syntax,ASTContext *context)

{
  ExpressionSyntax *pEVar1;
  bool bVar2;
  logic_t lVar3;
  Expression *pEVar4;
  Expression *args_2;
  OpenRangeExpression *expr;
  Type *pTVar5;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *rhs;
  SourceLocation location;
  Diagnostic *pDVar6;
  char *func;
  bitmask<slang::ast::ASTFlags> extraFlags;
  char cVar7;
  Type *pTVar8;
  ConstantValue cvl;
  ConstantValue cvr;
  Type *local_88;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  char local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  pEVar1 = (syntax->left).ptr;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    extraFlags.m_bits._0_4_ = (uint)(context->flags).m_bits & 0x800;
    extraFlags.m_bits._4_4_ = 0;
    pEVar4 = Expression::create(comp,pEVar1,context,extraFlags,(Type *)0x0);
    pEVar1 = (syntax->right).ptr;
    if (pEVar1 != (ExpressionSyntax *)0x0) {
      args_2 = Expression::create(comp,pEVar1,context,extraFlags,(Type *)0x0);
      pTVar8 = comp->voidType;
      local_80._M_rest._0_16_ =
           (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      expr = BumpAllocator::
             emplace<slang::ast::OpenRangeExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                       (&comp->super_BumpAllocator,pTVar8,pEVar4,args_2,(SourceRange *)&local_80);
      bVar2 = Expression::bad(pEVar4);
      if ((bVar2) || (bVar2 = Expression::bad(args_2), bVar2)) {
LAB_003c9e64:
        pEVar4 = Expression::badExpr(comp,&expr->super_Expression);
        return pEVar4;
      }
      pTVar8 = (pEVar4->type).ptr;
      if ((pTVar8 != (Type *)0x0) && (local_88 = (args_2->type).ptr, local_88 != (Type *)0x0)) {
        pTVar5 = pTVar8->canonical;
        if (pTVar5 == (Type *)0x0) {
          Type::resolveCanonical(pTVar8);
          pTVar5 = pTVar8->canonical;
        }
        if ((pTVar5->super_Symbol).kind == UnboundedType) {
          pTVar8 = comp->intType;
          if (pTVar8 == (Type *)0x0) goto LAB_003c9eba;
          pTVar5 = local_88->canonical;
          if (pTVar5 == (Type *)0x0) {
            Type::resolveCanonical(local_88);
            pTVar5 = local_88->canonical;
          }
          if ((pTVar5->super_Symbol).kind == UnboundedType) {
            ASTContext::addDiag(context,(DiagCode)0x740007,(expr->super_Expression).sourceRange);
          }
        }
        pTVar5 = local_88->canonical;
        if (pTVar5 == (Type *)0x0) {
          Type::resolveCanonical(local_88);
          pTVar5 = local_88->canonical;
        }
        if (((pTVar5->super_Symbol).kind == UnboundedType) &&
           (local_88 = comp->intType, local_88 == (Type *)0x0)) {
LAB_003c9eba:
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x1b,
                     "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
                    );
        }
        bVar2 = Type::isNumeric(pTVar8);
        if (((bVar2) && (bVar2 = Type::isNumeric(local_88), bVar2)) ||
           ((bVar2 = Expression::isImplicitString(pEVar4), bVar2 &&
            (bVar2 = Expression::isImplicitString(args_2), bVar2)))) {
          ASTContext::tryEval((ConstantValue *)&local_80,context,pEVar4);
          ASTContext::tryEval((ConstantValue *)&local_58,context,args_2);
          if ((local_60 == '\x01') && (local_58._M_index == '\x01')) {
            this = std::
                   get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                             ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_80);
            rhs = std::
                  get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                            ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                              *)&local_58);
            lVar3 = SVInt::operator<=(this,rhs);
            cVar7 = lVar3.value == '\0';
            if (lVar3.value == '@') {
              cVar7 = -0x80;
            }
            if (lVar3.value == 0x80) {
              cVar7 = -0x80;
            }
            if (((cVar7 != '\0') && (cVar7 != -0x80)) && (cVar7 != '@')) {
              ASTContext::addDiag(context,(DiagCode)0xa00007,(expr->super_Expression).sourceRange);
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_58);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_80);
          return &expr->super_Expression;
        }
        location = parsing::Token::location(&syntax->colon);
        pDVar6 = ASTContext::addDiag(context,(DiagCode)0x240007,location);
        pDVar6 = Diagnostic::operator<<(pDVar6,pEVar4->sourceRange);
        pDVar6 = Diagnostic::operator<<(pDVar6,args_2->sourceRange);
        pDVar6 = ast::operator<<(pDVar6,pTVar8);
        ast::operator<<(pDVar6,local_88);
        goto LAB_003c9e64;
      }
      func = 
      "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
      goto LAB_003c9e99;
    }
  }
  func = 
  "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
  ;
LAB_003c9e99:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Expression& OpenRangeExpression::fromSyntax(Compilation& comp,
                                            const OpenRangeExpressionSyntax& syntax,
                                            const ASTContext& context) {
    // If we are allowed unbounded literals here, pass that along to subexpressions.
    bitmask<ASTFlags> flags = ASTFlags::None;
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral))
        flags = ASTFlags::AllowUnboundedLiteral;

    Expression& left = create(comp, *syntax.left, context, flags);
    Expression& right = create(comp, *syntax.right, context, flags);

    auto result = comp.emplace<OpenRangeExpression>(comp.getVoidType(), left, right,
                                                    syntax.sourceRange());
    if (left.bad() || right.bad())
        return badExpr(comp, result);

    auto lt = left.type;
    auto rt = right.type;
    if (lt->isUnbounded()) {
        lt = &comp.getIntType();
        if (rt->isUnbounded())
            context.addDiag(diag::OpenRangeUnbounded, result->sourceRange);
    }

    if (rt->isUnbounded())
        rt = &comp.getIntType();

    if (!(lt->isNumeric() && rt->isNumeric()) &&
        !(left.isImplicitString() && right.isImplicitString())) {
        auto& diag = context.addDiag(diag::BadOpenRange, syntax.colon.location());
        diag << left.sourceRange << right.sourceRange << *lt << *rt;
        return badExpr(comp, result);
    }

    auto cvl = context.tryEval(left);
    auto cvr = context.tryEval(right);
    if (cvl.isInteger() && cvr.isInteger() && bool(cvl.integer() > cvr.integer()))
        context.addDiag(diag::ReversedOpenRange, result->sourceRange);

    return *result;
}